

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VWAP.cpp
# Opt level: O1

void __thiscall VWAPOption::computePrice(VWAPOption *this,ofstream *file)

{
  ulong uVar1;
  size_t cnt;
  long lVar2;
  ostream *poVar3;
  int iVar4;
  double dVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined4 uVar11;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  double dVar12;
  double dVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  timer t;
  double local_c8;
  double local_c0;
  cpu_times local_b8;
  double local_98;
  double dStack_90;
  auto_cpu_timer local_80 [72];
  undefined1 local_38 [24];
  
  boost::timer::auto_cpu_timer::auto_cpu_timer(local_80,6);
  if (this->NPaths_ < 1) {
    local_c0 = 0.0;
    local_c8 = 0.0;
    local_98 = 0.0;
    dStack_90 = 0.0;
  }
  else {
    iVar4 = 0;
    lVar2 = 0;
    local_c8 = 0.0;
    local_c0 = 0.0;
    do {
      dVar5 = simulateSinglePath(this);
      uVar11 = (undefined4)((ulong)lVar2 >> 0x20);
      if (dVar5 <= this->K_) {
        uVar1 = lVar2 + 1;
        local_c8 = local_c8 + 0.0;
        if (1 < uVar1) {
          auVar6._8_4_ = (int)(uVar1 >> 0x20);
          auVar6._0_8_ = uVar1;
          auVar6._12_4_ = 0x45300000;
          dVar5 = (auVar6._8_8_ - DAT_00104020._8_8_) +
                  ((double)CONCAT44(0x43300000,(int)uVar1) - (double)DAT_00104020);
          dVar12 = 0.0 - local_c8 / dVar5;
          auVar7._8_4_ = uVar11;
          auVar7._0_8_ = lVar2;
          auVar7._12_4_ = 0x45300000;
          dVar13 = (auVar7._8_8_ - DAT_00104020._8_8_) +
                   ((double)CONCAT44(0x43300000,(int)lVar2) - (double)DAT_00104020);
          local_c0 = (local_c0 * dVar13) / dVar5 + (dVar12 * dVar12) / dVar13;
        }
      }
      else {
        dVar5 = dVar5 - this->K_;
        uVar1 = lVar2 + 1;
        local_c8 = local_c8 + dVar5;
        if (1 < uVar1) {
          uVar15 = SUB164(ZEXT816(0x4530000043300000),4);
          auVar9._8_4_ = (int)(uVar1 >> 0x20);
          auVar9._0_8_ = uVar1;
          auVar9._12_4_ = uVar15;
          uVar14 = SUB164(ZEXT816(0x4530000043300000),0);
          dVar12 = (auVar9._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(uVar14,(int)uVar1) - 4503599627370496.0);
          dVar5 = dVar5 - local_c8 / dVar12;
          auVar10._8_4_ = uVar11;
          auVar10._0_8_ = lVar2;
          auVar10._12_4_ = uVar15;
          dVar13 = (auVar10._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(uVar14,(int)lVar2) - 4503599627370496.0);
          local_c0 = (local_c0 * dVar13) / dVar12 + (dVar5 * dVar5) / dVar13;
        }
      }
      lVar2 = lVar2 + 1;
      iVar4 = iVar4 + 1;
    } while (iVar4 < this->NPaths_);
    auVar8._8_4_ = (int)((ulong)lVar2 >> 0x20);
    auVar8._0_8_ = lVar2;
    auVar8._12_4_ = 0x45300000;
    dStack_90 = auVar8._8_8_ - 1.9342813113834067e+25;
    local_98 = dStack_90 + ((double)CONCAT44(0x43300000,(int)lVar2) - 4503599627370496.0);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
  std::ostream::put(-0x78);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"computation time = ",0x13);
  boost::timer::cpu_timer::elapsed();
  boost::timer::format_abi_cxx11_(&local_b8,(short)local_38);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)local_b8.wall,local_b8.user);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  if ((nanosecond_type *)local_b8.wall != &local_b8.system) {
    operator_delete((void *)local_b8.wall,local_b8.system + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"sigmaPrice = ",0xd);
  poVar3 = std::ostream::_M_insert<double>(this->sigmaPrice_);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"price = ",8);
  local_c8 = local_c8 / local_98;
  poVar3 = std::ostream::_M_insert<double>(local_c8);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"stdDevPrice = ",0xe);
  if (local_c0 < 0.0) {
    dVar5 = sqrt(local_c0);
  }
  else {
    dVar5 = SQRT(local_c0);
  }
  poVar3 = std::ostream::_M_insert<double>(dVar5);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  poVar3 = std::ostream::_M_insert<double>(this->sigmaPrice_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
  poVar3 = std::ostream::_M_insert<double>(local_c8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
  if (local_c0 < 0.0) {
    local_c0 = sqrt(local_c0);
  }
  else {
    local_c0 = SQRT(local_c0);
  }
  poVar3 = std::ostream::_M_insert<double>(local_c0);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  boost::timer::auto_cpu_timer::~auto_cpu_timer(local_80);
  return;
}

Assistant:

void VWAPOption::computePrice(ofstream& file) {
    timer t;
    accumulator_set<double, stats<tag::mean, tag::variance(immediate) > > price;

    //compute estimate for VWAP price
    for (int i = 0; i < NPaths_; ++i) {
        double VWAP_T = simulateSinglePath();
        if((VWAP_T - K_ ) > 0)
        {
            price(VWAP_T - K_);
        }
        else
        {
            price(0.0);
        }
    }
    cout << std::endl;
    cout << "computation time = " << t.format(3) << std::endl;
    cout << "sigmaPrice = " << sigmaPrice_ << std::endl;
    cout << "price = " << mean(price) << std::endl;
    cout << "stdDevPrice = " << sqrt(variance(price)) << std::endl;

    file << sigmaPrice_
         << ", "
         << mean(price) //option price
         << ", "
         << sqrt(variance(price)) << std::endl;

}